

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QShaderDescription::InOutVariable>::moveAppend
          (QGenericArrayOps<QShaderDescription::InOutVariable> *this,InOutVariable *b,
          InOutVariable *e)

{
  InOutVariable *pIVar1;
  Data *pDVar2;
  char *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  int *piVar6;
  Data *pDVar7;
  BlockVariable *pBVar8;
  undefined8 uVar9;
  InOutVariable *pIVar10;
  int iVar11;
  ImageFlags IVar12;
  qsizetype qVar13;
  
  if ((b != e) && (b < e)) {
    pIVar1 = (this->super_QArrayDataPointer<QShaderDescription::InOutVariable>).ptr;
    qVar13 = (this->super_QArrayDataPointer<QShaderDescription::InOutVariable>).size;
    do {
      pDVar2 = (b->name).d.d;
      (b->name).d.d = (Data *)0x0;
      pIVar1[qVar13].name.d.d = pDVar2;
      pcVar3 = (b->name).d.ptr;
      (b->name).d.ptr = (char *)0x0;
      pIVar1[qVar13].name.d.ptr = pcVar3;
      qVar4 = (b->name).d.size;
      (b->name).d.size = 0;
      pIVar1[qVar13].name.d.size = qVar4;
      iVar11 = b->location;
      uVar9 = *(undefined8 *)&b->binding;
      pIVar10 = pIVar1 + qVar13;
      pIVar10->type = b->type;
      pIVar10->location = iVar11;
      *(undefined8 *)(&pIVar10->type + 2) = uVar9;
      IVar12.super_QFlagsStorageHelper<QShaderDescription::ImageFlag,_4>.
      super_QFlagsStorage<QShaderDescription::ImageFlag>.i =
           (b->imageFlags).super_QFlagsStorageHelper<QShaderDescription::ImageFlag,_4>;
      pIVar1[qVar13].imageFormat = b->imageFormat;
      pIVar1[qVar13].imageFlags =
           (ImageFlags)
           IVar12.super_QFlagsStorageHelper<QShaderDescription::ImageFlag,_4>.
           super_QFlagsStorage<QShaderDescription::ImageFlag>.i;
      pDVar5 = (b->arrayDims).d.d;
      (b->arrayDims).d.d = (Data *)0x0;
      pIVar1[qVar13].arrayDims.d.d = pDVar5;
      piVar6 = (b->arrayDims).d.ptr;
      (b->arrayDims).d.ptr = (int *)0x0;
      pIVar1[qVar13].arrayDims.d.ptr = piVar6;
      qVar4 = (b->arrayDims).d.size;
      (b->arrayDims).d.size = 0;
      pIVar1[qVar13].arrayDims.d.size = qVar4;
      pIVar1[qVar13].perPatch = b->perPatch;
      pDVar7 = (b->structMembers).d.d;
      (b->structMembers).d.d = (Data *)0x0;
      pIVar1[qVar13].structMembers.d.d = pDVar7;
      pBVar8 = (b->structMembers).d.ptr;
      (b->structMembers).d.ptr = (BlockVariable *)0x0;
      pIVar1[qVar13].structMembers.d.ptr = pBVar8;
      qVar4 = (b->structMembers).d.size;
      (b->structMembers).d.size = 0;
      pIVar1[qVar13].structMembers.d.size = qVar4;
      b = b + 1;
      qVar13 = (this->super_QArrayDataPointer<QShaderDescription::InOutVariable>).size + 1;
      (this->super_QArrayDataPointer<QShaderDescription::InOutVariable>).size = qVar13;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }